

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter.cpp
# Opt level: O0

bool __thiscall
Sonne::Counter::_CompareStringToBuffer
          (Counter *this,vector<char,_std::allocator<char>_> *buffer,string *compare,size_t *start)

{
  char cVar1;
  reference pvVar2;
  char *pcVar3;
  char *pcVar4;
  char *local_48;
  char *local_40;
  char *compareChar;
  size_t i;
  size_t *start_local;
  string *compare_local;
  vector<char,_std::allocator<char>_> *buffer_local;
  Counter *this_local;
  
  i = (size_t)start;
  start_local = (size_t *)compare;
  compare_local = (string *)buffer;
  buffer_local = (vector<char,_std::allocator<char>_> *)this;
  pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](buffer,*start);
  cVar1 = *pvVar2;
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)start_local);
  if (cVar1 == *pcVar3) {
    for (compareChar = (char *)0x1; pcVar3 = compareChar,
        pcVar4 = (char *)std::__cxx11::string::size(), pcVar3 < pcVar4;
        compareChar = compareChar + 1) {
      local_40 = (char *)std::__cxx11::string::at((ulong)start_local);
      local_48 = compareChar + *(long *)i;
      cVar1 = _GetBufferLookahead(this,(vector<char,_std::allocator<char>_> *)compare_local,
                                  (size_t *)&local_48);
      if (cVar1 != *local_40) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Counter::_CompareStringToBuffer(std::vector<char>& buffer, std::string& compare, const size_t& start)
{
    // check if the first character matches, and if not we can already say that the string doesn't match
    if (buffer[start] != compare[0])
    {
        return false;
    }

    for (size_t i = 1; i < compare.size(); i++)
    {
        char& compareChar = compare.at(i);

        if (_GetBufferLookahead(buffer, start + i) != compareChar)
        {
            return false; // the current character is not the same of that in the buffer, so no match
        }
    }

    return true;
}